

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O1

bool __thiscall idx2::mallocator::Alloc(mallocator *this,buffer *Buf,i64 Bytes)

{
  undefined1 extraout_AL;
  byte *pbVar1;
  undefined8 *puVar2;
  printer Pr;
  undefined8 local_30 [3];
  
  pbVar1 = (byte *)malloc(Bytes);
  Buf->Data = pbVar1;
  if (pbVar1 != (byte *)0x0) {
    Buf->Bytes = Bytes;
    Buf->Alloc = &this->super_allocator;
    return true;
  }
  puVar2 = local_30;
  Alloc();
  free((void *)*puVar2);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  return (bool)extraout_AL;
}

Assistant:

bool
mallocator::Alloc(buffer* Buf, i64 Bytes)
{
  idx2_Assert(!Buf->Data || Buf->Bytes == 0, "Buffer not freed before allocating new memory");
  Buf->Data = (byte*)malloc(size_t(Bytes));
  idx2_AbortIf(!(Buf->Data), "Out of memory: cannot allocate %" PRIx64 " bytes\n", Bytes);
  Buf->Bytes = Bytes;
  Buf->Alloc = this;
  return true;
}